

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O1

void printInfo(void)

{
  uint uVar1;
  int i_2;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int i_5;
  long lVar5;
  long lVar6;
  int i_4;
  uint uVar7;
  char (*__s) [26];
  int i;
  long lVar8;
  
  printf("Round %d:  %d vs %d\n",(ulong)(uint)turnID,(ulong)(uint)gameBoard.elimTotal[0],
         (ulong)(uint)gameBoard.elimTotal[1]);
  printf("count:");
  lVar8 = 0;
  do {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[0][lVar8]);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  printf("\ncount:");
  lVar8 = 0;
  do {
    printf(" %d",(ulong)(uint)gameBoard.typeCountForColor[1][lVar8]);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  putchar(10);
  putchar(10);
  uVar4 = 0x14;
  __s = printInfo::ans;
  do {
    sprintf(*__s,"%2d",uVar4 & 0xffffffff);
    __s = __s + 1;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  lVar8 = 0x18;
  do {
    printInfo::ans[0][lVar8] = '|';
    *(undefined1 *)(lVar8 + 0x121cc5) = 0x7c;
    *(undefined1 *)((long)&val.limit_ + lVar8 + 2) = 0x7c;
    lVar8 = lVar8 + 0x1a;
  } while (lVar8 != 0x220);
  lVar8 = 1;
  lVar2 = 0x121ec1;
  lVar5 = 0x1212b8;
  do {
    lVar6 = 0;
    do {
      *(char *)(lVar2 + lVar6) = " *+"[*(int *)(lVar5 + lVar6 * 4)];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    lVar8 = lVar8 + 1;
    lVar2 = lVar2 + -0x1a;
    lVar5 = lVar5 + 0x30;
  } while (lVar8 != 0x15);
  lVar8 = 1;
  lVar2 = 0x121ecc;
  lVar5 = 0x1216d8;
  do {
    lVar6 = 0;
    do {
      *(char *)(lVar2 + lVar6) = " *+"[*(int *)(lVar5 + lVar6 * 4)];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    lVar8 = lVar8 + 1;
    lVar2 = lVar2 + -0x1a;
    lVar5 = lVar5 + 0x30;
  } while (lVar8 != 0x15);
  lVar8 = 0;
  do {
    puts(printInfo::ans[0] + lVar8);
    lVar8 = lVar8 + 0x1a;
  } while (lVar8 != 0x208);
  printf("  ");
  iVar3 = 0x17;
  do {
    putchar(0x2d);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  printf("\n   ");
  uVar7 = 1;
  do {
    uVar4 = (ulong)uVar7;
    if (uVar7 == 10) {
      uVar4 = 0;
    }
    printf("%d",uVar4);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0xb);
  putchar(0x7c);
  uVar7 = 1;
  do {
    uVar1 = uVar7;
    if (uVar7 == 10) {
      uVar1 = 0;
    }
    printf("%d",(ulong)uVar1);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0xb);
  putchar(10);
  getchar();
  return;
}

Assistant:

void printInfo()
{
    printf("Round %d:  %d vs %d\n", turnID, gameBoard.elimTotal[0], gameBoard.elimTotal[1]);
    printf("count:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[0][i]);
    printf("\ncount:");
    for (int i = 0; i < 7; ++i)
        printf(" %d", gameBoard.typeCountForColor[1][i]);
    putchar('\n');
    putchar('\n');
    static char ans[20][26] = {};
    for (int i = 1; i <= 20; ++i)
        sprintf(ans[i - 1], "%2d", 21 - i);
    for (int i = 0; i < 20; ++i)
        ans[i][2] = ans[i][13] = ans[i][24] = '|';
    static const char mp[3] = {' ', '*', '+'};
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][2 + j] = mp[gameBoard.gridInfo[0][i][j]];
    for (int i = 1; i <= 20; ++i)
        for (int j = 1; j <= 10; ++j)
            ans[20 - i][13 + j] = mp[gameBoard.gridInfo[1][i][j]];
    for (int i = 0; i < 20; ++i)
        puts(ans[i]);
    printf("  ");
    for (int i = 0; i < 23; ++i)
        putchar('-');
    printf("\n   ");
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('|');
    for (int i = 1; i <= 10; ++i)
        printf("%d", i % 10);
    putchar('\n');
    getchar();
}